

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# message.h
# Opt level: O0

upb_MiniTable * upb_MiniTable_GetSubMessageTable(upb_MiniTable *m,upb_MiniTableField *f)

{
  _Bool _Var1;
  upb_CType uVar2;
  upb_MiniTable *local_28;
  upb_MiniTable *ret;
  upb_MiniTableField *f_local;
  upb_MiniTable *m_local;
  
  uVar2 = upb_MiniTableField_CType(f);
  if (uVar2 != kUpb_CType_Message) {
    __assert_fail("upb_MiniTableField_CType(f) == kUpb_CType_Message",
                  "/workspace/llm4binary/github/license_c_cmakelists/pybind[P]pybind11_protobuf/build_O0/_deps/protobuf-src/upb/mini_table/internal/message.h"
                  ,0x82,
                  "const struct upb_MiniTable *upb_MiniTable_GetSubMessageTable(const struct upb_MiniTable *, const struct upb_MiniTableField *)"
                 );
  }
  local_28 = upb_MiniTable_SubMessage(m,f);
  if (local_28 == (upb_MiniTable *)0x0) {
    __assert_fail("ret",
                  "/workspace/llm4binary/github/license_c_cmakelists/pybind[P]pybind11_protobuf/build_O0/_deps/protobuf-src/upb/mini_table/internal/message.h"
                  ,0x84,
                  "const struct upb_MiniTable *upb_MiniTable_GetSubMessageTable(const struct upb_MiniTable *, const struct upb_MiniTableField *)"
                 );
  }
  _Var1 = _upb_MiniTable_IsEmpty_dont_copy_me__upb_internal_use_only(local_28);
  if (_Var1) {
    local_28 = (upb_MiniTable *)0x0;
  }
  return local_28;
}

Assistant:

UPB_API_INLINE const struct upb_MiniTable* upb_MiniTable_GetSubMessageTable(
    const struct upb_MiniTable* m, const struct upb_MiniTableField* f) {
  UPB_ASSUME(upb_MiniTableField_CType(f) == kUpb_CType_Message);
  const struct upb_MiniTable* ret = upb_MiniTable_SubMessage(m, f);
  UPB_ASSUME(ret);
  return UPB_PRIVATE(_upb_MiniTable_IsEmpty)(ret) ? NULL : ret;
}